

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_base.cpp
# Opt level: O0

string * HexStr_abi_cxx11_(Span<const_unsigned_char> s)

{
  size_t sVar1;
  uchar *puVar2;
  const_pointer pvVar3;
  char *pcVar4;
  size_type sVar5;
  string *in_RDI;
  long in_FS_OFFSET;
  uint8_t v;
  uchar *__end1;
  uchar *__begin1;
  Span<const_unsigned_char> *__range1;
  char *it;
  string *rv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff60;
  array<std::array<char,_2UL>,_256UL> *in_stack_ffffffffffffff68;
  allocator<char> *in_stack_ffffffffffffff70;
  string *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uchar *local_58;
  char *local_48;
  allocator<char> local_19 [17];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __n = in_RDI;
  sVar1 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)in_stack_ffffffffffffff58);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar1 * 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(size_type)__n,(char)((ulong)in_RDI >> 0x38),in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator(local_19);
  local_48 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (in_stack_ffffffffffffff58);
  local_58 = Span<const_unsigned_char>::begin
                       ((Span<const_unsigned_char> *)in_stack_ffffffffffffff58);
  puVar2 = Span<const_unsigned_char>::end((Span<const_unsigned_char> *)in_stack_ffffffffffffff58);
  for (; local_58 != puVar2; local_58 = local_58 + 1) {
    pcVar4 = local_48;
    std::array<std::array<char,_2UL>,_256UL>::operator[]
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    pvVar3 = std::array<char,_2UL>::data((array<char,_2UL> *)in_stack_ffffffffffffff58);
    *(undefined2 *)pcVar4 = *(undefined2 *)pvVar3;
    local_48 = local_48 + 2;
  }
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (in_stack_ffffffffffffff58);
  sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_ffffffffffffff58);
  if (local_48 != pcVar4 + sVar5) {
    __assert_fail("it == rv.data() + rv.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/hex_base.cpp"
                  ,0x29,"std::string HexStr(const Span<const uint8_t>)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string HexStr(const Span<const uint8_t> s)
{
    std::string rv(s.size() * 2, '\0');
    static constexpr auto byte_to_hex = CreateByteToHexMap();
    static_assert(sizeof(byte_to_hex) == 512);

    char* it = rv.data();
    for (uint8_t v : s) {
        std::memcpy(it, byte_to_hex[v].data(), 2);
        it += 2;
    }

    assert(it == rv.data() + rv.size());
    return rv;
}